

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::date_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>
          (Interpolator<false> *this,date_t *v_t,Vector *result,
          MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *accessor)

{
  long lVar1;
  QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
  __comp;
  QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
  __comp_00;
  QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
  __comp_01;
  MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *in_RCX;
  interval_t *hi_00;
  interval_t *in_RDI;
  RESULT_TYPE RVar2;
  interval_t iVar3;
  interval_t hi;
  interval_t lo;
  QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
  comp;
  undefined1 in_stack_ffffffffffffff18 [16];
  date_t *in_stack_ffffffffffffff60;
  date_t *in_stack_ffffffffffffff68;
  date_t *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar4;
  undefined8 in_stack_ffffffffffffff88;
  Vector *pVVar5;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 local_48 [56];
  interval_t local_10;
  
  QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>::
  QuantileCompare((QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
                   *)local_48,in_RCX,(bool)((byte)in_RDI->months & 1));
  lVar1._0_4_ = in_RDI[1].months;
  lVar1._4_4_ = in_RDI[1].days;
  if (in_RDI[1].micros == lVar1) {
    __comp.accessor_r =
         (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)
         in_stack_ffffffffffffff88;
    __comp.accessor_l =
         (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)
         in_stack_ffffffffffffff80;
    __comp._16_8_ = in_stack_ffffffffffffff90;
    ::std::
    nth_element<duckdb::date_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__comp)
    ;
    MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
              (in_stack_ffffffffffffff18._8_8_,in_stack_ffffffffffffff18._0_8_);
    local_10 = CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>
                         (in_RDI,(Vector *)local_48._16_8_);
  }
  else {
    __comp_00.accessor_r =
         (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)local_48._16_8_;
    __comp_00.accessor_l =
         (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)local_48._8_8_;
    __comp_00._16_8_ = in_stack_ffffffffffffff90;
    pMVar4 = (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)local_48._8_8_;
    pVVar5 = (Vector *)local_48._16_8_;
    ::std::
    nth_element<duckdb::date_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               __comp_00);
    __comp_01.accessor_r =
         (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *)pVVar5;
    __comp_01.accessor_l = pMVar4;
    __comp_01._16_8_ = in_stack_ffffffffffffff90;
    ::std::
    nth_element<duckdb::date_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>
              (in_stack_ffffffffffffff70,(date_t *)local_48._16_8_,(date_t *)local_48._8_8_,
               __comp_01);
    MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
              (in_stack_ffffffffffffff18._8_8_,in_stack_ffffffffffffff18._0_8_);
    CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>(in_RDI,(Vector *)local_48._16_8_)
    ;
    RVar2 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                      (in_stack_ffffffffffffff18._8_8_,in_stack_ffffffffffffff18._0_8_);
    hi_00 = (interval_t *)RVar2.micros;
    iVar3 = CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>
                      (in_RDI,(Vector *)local_48._16_8_);
    local_10 = CastInterpolation::Interpolate<duckdb::interval_t>
                         ((interval_t *)iVar3.micros,iVar3._0_8_,hi_00);
  }
  return local_10;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}